

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

double __thiscall despot::Function::GetValue(Function *this,int pid,int cid)

{
  pointer pvVar1;
  const_iterator cVar2;
  _Base_ptr *pp_Var3;
  key_type_conflict local_14;
  
  pvVar1 = (this->values_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->values_).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar1) {
    cVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
            ::find(&(this->map_).
                    super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[pid]._M_t,&local_14);
    if (cVar2._M_node ==
        &(this->map_).
         super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[pid]._M_t._M_impl.super__Rb_tree_header._M_header
       ) {
      return 0.0;
    }
    pp_Var3 = &cVar2._M_node[1]._M_parent;
  }
  else {
    pp_Var3 = (_Base_ptr *)
              (pvVar1[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + cid);
  }
  return (double)*pp_Var3;
}

Assistant:

double Function::GetValue(int pid, int cid) const {
	if (values_.size() > 0) { // TODO: possible refactoring to use a single data structure
		return values_[pid][cid];
	} else {
		map<int, double>::const_iterator it = map_[pid].find(cid);
		return it != map_[pid].end() ? it->second : 0;
	}
}